

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_bspline_basis(REF_INT degree,REF_DBL *knots,REF_DBL t,REF_INT span,REF_DBL *N)

{
  double dVar1;
  double local_178;
  double local_168;
  double local_160;
  double local_150;
  REF_DBL temp;
  REF_DBL saved;
  REF_DBL right [16];
  REF_DBL left [16];
  REF_INT r;
  REF_INT j;
  REF_DBL *N_local;
  REF_INT span_local;
  REF_DBL t_local;
  REF_DBL *knots_local;
  REF_INT degree_local;
  
  if (degree < 0x10) {
    *N = 1.0;
    for (left[0xf]._4_4_ = 1; left[0xf]._4_4_ <= degree; left[0xf]._4_4_ = left[0xf]._4_4_ + 1) {
      right[(long)left[0xf]._4_4_ + 0xf] = t - knots[(span + 1) - left[0xf]._4_4_];
      right[(long)left[0xf]._4_4_ + -1] = knots[span + left[0xf]._4_4_] - t;
      temp = 0.0;
      for (left[0xf]._0_4_ = 0; (int)left[0xf]._0_4_ < left[0xf]._4_4_;
          left[0xf]._0_4_ = left[0xf]._0_4_ + 1) {
        if ((right[(long)(int)(left[0xf]._0_4_ + 1) + -1] +
            right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf]) * 1e+20 <= 0.0) {
          local_150 = -((right[(long)(int)(left[0xf]._0_4_ + 1) + -1] +
                        right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf]) * 1e+20);
        }
        else {
          local_150 = (right[(long)(int)(left[0xf]._0_4_ + 1) + -1] +
                      right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf]) * 1e+20;
        }
        if (N[(int)left[0xf]._0_4_] <= 0.0) {
          local_160 = -N[(int)left[0xf]._0_4_];
        }
        else {
          local_160 = N[(int)left[0xf]._0_4_];
        }
        if (local_150 <= local_160) {
          printf("N[%d] %f l %f r %f\n",N[(int)left[0xf]._0_4_],
                 right[(long)(int)(left[0xf]._0_4_ + 1) + -1],
                 right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf],(ulong)left[0xf]._0_4_)
          ;
        }
        if ((right[(long)(int)(left[0xf]._0_4_ + 1) + -1] +
            right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf]) * 1e+20 <= 0.0) {
          local_168 = -((right[(long)(int)(left[0xf]._0_4_ + 1) + -1] +
                        right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf]) * 1e+20);
        }
        else {
          local_168 = (right[(long)(int)(left[0xf]._0_4_ + 1) + -1] +
                      right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf]) * 1e+20;
        }
        if (N[(int)left[0xf]._0_4_] <= 0.0) {
          local_178 = -N[(int)left[0xf]._0_4_];
        }
        else {
          local_178 = N[(int)left[0xf]._0_4_];
        }
        if (local_168 <= local_178) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x109f,"ref_geom_bspline_basis","right+left is zero");
          return 1;
        }
        dVar1 = N[(int)left[0xf]._0_4_] /
                (right[(long)(int)(left[0xf]._0_4_ + 1) + -1] +
                right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf]);
        N[(int)left[0xf]._0_4_] = right[(long)(int)(left[0xf]._0_4_ + 1) + -1] * dVar1 + temp;
        temp = right[(long)(int)(left[0xf]._4_4_ - left[0xf]._0_4_) + 0xf] * dVar1;
      }
      N[left[0xf]._4_4_] = temp;
    }
    knots_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1094,
           "ref_geom_bspline_basis","temp variables sized smaller than degree");
    knots_local._4_4_ = 1;
  }
  return knots_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_basis(REF_INT degree, REF_DBL *knots,
                                          REF_DBL t, REF_INT span, REF_DBL *N) {
  REF_INT j, r;
  REF_DBL left[16];
  REF_DBL right[16];
  REF_DBL saved, temp;
  RAS(degree < 16, "temp variables sized smaller than degree");
  N[0] = 1.0;
  for (j = 1; j <= degree; j++) {
    left[j] = t - knots[span + 1 - j];
    right[j] = knots[span + j] - t;
    saved = 0.0;
    for (r = 0; r < j; r++) {
      if (!ref_math_divisible(N[r], (right[r + 1] + left[j - r]))) {
        printf("N[%d] %f l %f r %f\n", r, N[r], right[r + 1], left[j - r]);
      }
      RAS(ref_math_divisible(N[r], (right[r + 1] + left[j - r])),
          "right+left is zero");
      temp = N[r] / (right[r + 1] + left[j - r]);
      N[r] = saved + right[r + 1] * temp;
      saved = left[j - r] * temp;
    }
    N[j] = saved;
  }
  return REF_SUCCESS;
}